

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall SuiteMessageTests::TestgetFieldIfPresent::RunImpl(TestgetFieldIfPresent *this)

{
  TestResults *pTVar1;
  bool bVar2;
  __type _Var3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  allocator<char> local_241;
  TestDetails local_240;
  MsgType stored;
  MsgType initial;
  Message message;
  
  FIX::Message::Message(&message);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stored,"A",(allocator<char> *)&local_240);
  FIX::MsgType::MsgType(&initial,(STRING *)&stored);
  std::__cxx11::string::~string((string *)&stored);
  bVar2 = FIX::FieldMap::getFieldIfSet((FieldMap *)&message,(FieldBase *)&initial);
  if (bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&stored,*ppTVar5,0x78);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,(TestDetails *)&stored,"!message.getFieldIfSet( initial )");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"A",&local_241);
  FIX::MsgType::MsgType(&stored,(STRING *)&local_240);
  _Var3 = std::operator==(&initial.super_StringField.super_FieldBase.m_string,
                          &stored.super_StringField.super_FieldBase.m_string);
  FIX::FieldBase::~FieldBase((FieldBase *)&stored);
  std::__cxx11::string::~string((string *)&local_240);
  if (!_Var3) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&stored,*ppTVar5,0x79);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,(TestDetails *)&stored,"initial == FIX::MsgType(\"A\")");
  }
  FIX::FieldMap::setField((FieldMap *)&message,(FieldBase *)&initial,true);
  FIX::MsgType::MsgType(&stored);
  bVar2 = FIX::FieldMap::getFieldIfSet((FieldMap *)&message,(FieldBase *)&stored);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_240,*ppTVar5,0x7d);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_240,"message.getFieldIfSet( stored )");
  }
  _Var3 = std::operator==(&stored.super_StringField.super_FieldBase.m_string,
                          &initial.super_StringField.super_FieldBase.m_string);
  if (!_Var3) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_240,*ppTVar5,0x7e);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_240,"stored == initial");
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&stored);
  FIX::FieldBase::~FieldBase((FieldBase *)&initial);
  FIX::Message::~Message(&message);
  return;
}

Assistant:

TEST(getFieldIfPresent)
{
  FIX::Message message;
  FIX::MsgType initial("A");
  CHECK( !message.getFieldIfSet( initial ) );
  CHECK( initial == FIX::MsgType("A") );

  message.setField( initial );
  FIX::MsgType stored;
  CHECK( message.getFieldIfSet( stored ) );
  CHECK( stored == initial );
}